

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

bool __thiscall ON_PolyEdgeSegment::Read(ON_PolyEdgeSegment *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  bool bReversed;
  int major_version;
  int minor_version;
  ON_Interval real_curve_domain;
  ON_Interval this_domain;
  bool local_49;
  int local_48 [2];
  ON_Interval local_40;
  ON_Interval local_30;
  
  Init(this);
  bVar2 = false;
  local_48[0] = 0;
  local_48[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_48,local_48 + 1);
  if (bVar1) {
    bVar1 = local_48[0] == 1;
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_object_id), bVar1)) &&
        (bVar1 = ON_BinaryArchive::ReadComponentIndex(archive,&this->m_component_index), bVar1)) &&
       ((bVar1 = ON_BinaryArchive::ReadInterval(archive,&this->m_edge_domain), bVar1 &&
        (bVar1 = ON_BinaryArchive::ReadInterval(archive,&this->m_trim_domain), bVar1)))) {
      local_49 = false;
      bVar1 = ON_BinaryArchive::ReadBool(archive,&local_49);
      if (bVar1) {
        ON_Interval::ON_Interval(&local_30);
        bVar1 = ON_BinaryArchive::ReadInterval(archive,&local_30);
        if (bVar1) {
          ON_Interval::ON_Interval(&local_40);
          bVar1 = ON_BinaryArchive::ReadInterval(archive,&local_40);
          if (bVar1) {
            if (local_49 == true) {
              ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
            }
            ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,local_30);
            ON_CurveProxy::SetProxyCurveDomain(&this->super_ON_CurveProxy,local_40);
          }
        }
      }
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_PolyEdgeSegment::Read( ON_BinaryArchive& archive )
{
  Init();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;
  for(;;)
  {
    rc = (1 == major_version);
    if ( !rc )
      break;

    rc = archive.ReadUuid(m_object_id);
    if (!rc) break;
    rc = archive.ReadComponentIndex(m_component_index);
    if (!rc) break;
    rc = archive.ReadInterval(m_edge_domain);
    if (!rc) break;
    rc = archive.ReadInterval(m_trim_domain);
    if (!rc) break;

    // Read ON_ProxyCurve values we need
    bool bReversed = false;
    rc = archive.ReadBool(&bReversed);
    if (!rc) break;
    ON_Interval this_domain;
    rc = archive.ReadInterval(this_domain);
    if (!rc) break;
    ON_Interval real_curve_domain;
    rc = archive.ReadInterval(real_curve_domain);
    if (!rc) break;

    if ( bReversed)
      ON_CurveProxy::Reverse();
    ON_CurveProxy::SetDomain(this_domain);
    ON_CurveProxy::SetProxyCurveDomain(real_curve_domain);

    break;
  }
  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}